

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadCastServer.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  WrapTcpService *__tmp;
  EventLoop *this_01;
  bool bVar7;
  PTR listenThrean;
  undefined8 local_a8;
  long local_a0;
  long *local_98 [2];
  long local_88 [2];
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  if (argc == 2) {
    iVar1 = atoi(argv[1]);
    brynet::net::base::InitSocket();
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108c28;
    this = p_Var2 + 1;
    brynet::net::WrapTcpService::WrapTcpService((WrapTcpService *)this);
    this_00 = service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
    bVar7 = service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var2;
    if (bVar7) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    puVar3 = (undefined8 *)operator_new(0xe0);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_ptr_inplace_00108cd8;
    this_01 = (EventLoop *)(puVar3 + 2);
    brynet::net::EventLoop::EventLoop(this_01);
    brynet::net::ListenThread::Create();
    local_98[0] = local_88;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"0.0.0.0","");
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + 1;
      UNLOCK();
    }
    else {
      *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + 1;
    }
    if (local_a0 != 0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_a0 + 8) = *(int *)(local_a0 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_a0 + 8) = *(int *)(local_a0 + 8) + 1;
      }
    }
    local_68 = (code *)0x0;
    pcStack_60 = (code *)0x0;
    local_78 = (undefined8 *)0x0;
    uStack_70 = 0;
    local_78 = (undefined8 *)operator_new(0x20);
    *local_78 = this_01;
    local_78[1] = puVar3;
    local_78[2] = local_a8;
    local_78[3] = local_a0;
    pcStack_60 = std::
                 _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/BroadCastServer.cpp:83:55)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/examples/BroadCastServer.cpp:83:55)>
               ::_M_manager;
    brynet::net::ListenThread::startListen(local_a8,0,local_98,iVar1);
    if (local_68 != (code *)0x0) {
      (*local_68)(&local_78,&local_78,3);
    }
    if (local_98[0] != local_88) {
      operator_delete(local_98[0],local_88[0] + 1);
    }
    local_58 = 0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    brynet::net::WrapTcpService::startWorkThread
              (service.super___shared_ptr<brynet::net::WrapTcpService,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,2);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    do {
      lVar4 = std::chrono::_V2::steady_clock::now();
      do {
        brynet::net::EventLoop::loop((long)this_01);
        lVar5 = std::chrono::_V2::steady_clock::now();
      } while (lVar5 - lVar4 < 1000000000);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cost ",5);
      poVar6 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ms, clientnum:",0xf);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", recv",6);
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," K/s, ",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"num : ",6);
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,", send ",7);
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," M/s, ",6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," num: ",6);
      poVar6 = std::ostream::_M_insert<long_long>((longlong)poVar6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      LOCK();
      TotalRecvLen.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      TotalSendLen.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      RecvPacketNum.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
      LOCK();
      SendPacketNum.super___atomic_base<long_long>._M_i = (__atomic_base<long_long>)0;
      UNLOCK();
    } while( true );
  }
  fwrite("Usage : <listen port> \n",0x17,1,_stderr);
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage : <listen port> \n");
        exit(-1);
    }

    int port = atoi(argv[1]);
    brynet::net::base::InitSocket();

    service = std::make_shared<WrapTcpService>();
    auto mainLoop = std::make_shared<EventLoop>();
    auto listenThrean = ListenThread::Create();

    listenThrean->startListen(false, "0.0.0.0", port, [mainLoop, listenThrean](TcpSocket::PTR socket) {
        socket->SocketNodelay();
        socket->SetSendSize(32 * 1024);
        socket->SetRecvSize(32 * 1024);

        auto enterCallback = [mainLoop](const TCPSession::PTR& session) {
            mainLoop->pushAsyncProc([session]() {
                addClientID(session);
            });

            session->setDisConnectCallback([mainLoop](const TCPSession::PTR& session) {
                mainLoop->pushAsyncProc([session]() {
                    removeClientID(session);
                });
            });

            session->setDataCallback([mainLoop](const TCPSession::PTR& session, const char* buffer, size_t len) {
                const char* parseStr = buffer;
                size_t totalProcLen = 0;
                size_t leftLen = len;

                while (true)
                {
                    bool flag = false;
                    auto HEAD_LEN = sizeof(uint32_t) + sizeof(uint16_t);
                    if (leftLen >= HEAD_LEN)
                    {
                        BasePacketReader rp(parseStr, leftLen);
                        auto packet_len = rp.readUINT32();
                        if (leftLen >= packet_len && packet_len >= HEAD_LEN)
                        {
                            auto packet = DataSocket::makePacket(parseStr, packet_len);
                            mainLoop->pushAsyncProc([packet]() {
                                broadCastPacket(packet);
                            });

                            totalProcLen += packet_len;
                            parseStr += packet_len;
                            leftLen -= packet_len;
                            flag = true;
                        }
                        rp.skipAll();
                    }

                    if (!flag)
                    {
                        break;
                    }
                }

                return totalProcLen;
            });
        };
        service->addSession(std::move(socket),
            AddSessionOption::WithEnterCallback(enterCallback),
            AddSessionOption::WithMaxRecvBufferSize(1024 * 1024));
    });

    service->startWorkThread(2);

    auto now = std::chrono::steady_clock::now();
    while (true)
    {
        mainLoop->loop(10);
        auto diff = std::chrono::steady_clock::now() - now;
        if (diff >= std::chrono::seconds(1))
        {
            auto msDiff = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "cost " << 
                msDiff << " ms, clientnum:" << 
                getClientNum() << ", recv" <<
                (TotalRecvLen / 1024) * 1000 / msDiff  << 
                " K/s, " << "num : " << 
                RecvPacketNum * 1000 / msDiff << ", send " <<
                (TotalSendLen / 1024) / 1024 * 1000 / msDiff <<
                " M/s, " << " num: " << 
                SendPacketNum * 1000 / msDiff << std::endl;
            TotalRecvLen = 0;
            TotalSendLen = 0;
            RecvPacketNum = 0;
            SendPacketNum = 0;
            now = std::chrono::steady_clock::now();
        }
    }

    service->stopWorkThread();

    return 0;
}